

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void CheckLength(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  bool bVar1;
  Bool BVar2;
  char *pcStack_28;
  Bool percentFound;
  tmbstr p;
  AttVal *attval_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if ((attval == (AttVal *)0x0) || (attval->value == (tmbstr)0x0)) {
    prvTidyReportAttrError(doc,node,attval,0x256);
  }
  else if ((((attval == (AttVal *)0x0) || (attval->dict == (Attribute *)0x0)) ||
           (attval->dict->id != TidyAttr_WIDTH)) ||
          ((((node == (Node *)0x0 || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_COL))
           && (((node == (Node *)0x0 || (node->tag == (Dict *)0x0)) ||
               (node->tag->id != TidyTag_COLGROUP)))))) {
    pcStack_28 = attval->value;
    BVar2 = prvTidyIsDigit((int)*pcStack_28);
    if (BVar2 == no) {
      prvTidyReportAttrError(doc,node,attval,0x22b);
    }
    else {
      bVar1 = false;
      do {
        while( true ) {
          pcStack_28 = pcStack_28 + 1;
          if (*pcStack_28 == '\0') {
            return;
          }
          if ((bVar1) || (*pcStack_28 != '%')) break;
          bVar1 = true;
        }
      } while ((!bVar1) && (BVar2 = prvTidyIsDigit((int)*pcStack_28), BVar2 != no));
      prvTidyReportAttrError(doc,node,attval,0x22b);
    }
  }
  return;
}

Assistant:

void CheckLength( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    tmbstr p;
    
    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    /* don't check for <col width=...> and <colgroup width=...> */
    if (attrIsWIDTH(attval) && (nodeIsCOL(node) || nodeIsCOLGROUP(node)))
        return;

    p = attval->value;
    
    if (!TY_(IsDigit)(*p++))
    {
        TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }
    else
    {
        Bool percentFound = no;
        while (*p)
        {
            if (!percentFound && *p == '%')
            {
                percentFound = yes;
            }
            else if (percentFound || !TY_(IsDigit)(*p))
            {
                TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
                break;
            }

            ++p;
        }
    }
}